

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *ncname;
  xmlAttributePtr pxVar3;
  xmlNs *pxVar4;
  xmlChar fattr [50];
  xmlChar felem [50];
  xmlChar axStack_a8 [64];
  xmlChar local_68 [56];
  
  if (attr == (xmlAttrPtr)0x0) {
    return 0;
  }
  pxVar2 = attr->name;
  if (pxVar2 == (xmlChar *)0x0) {
    return 0;
  }
  pxVar4 = attr->ns;
  if (((((pxVar4 == (xmlNs *)0x0) || (pxVar4->prefix == (xmlChar *)0x0)) || (*pxVar2 != 'i')) ||
      ((pxVar2[1] != 'd' || (pxVar2[2] != '\0')))) ||
     (iVar1 = strcmp((char *)pxVar4->prefix,"xml"), iVar1 != 0)) {
    if (doc == (xmlDocPtr)0x0) {
      return 0;
    }
    if (((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) &&
       (doc->type != XML_HTML_DOCUMENT_NODE)) {
      return 0;
    }
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
      iVar1 = xmlStrEqual("id",pxVar2);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = xmlStrEqual("name",attr->name);
      if (iVar1 != 0) {
        if (elem == (xmlNodePtr)0x0) {
          return 1;
        }
        iVar1 = xmlStrEqual(elem->name,"a");
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      if (elem == (xmlNodePtr)0x0) {
        return 0;
      }
      if ((elem->ns == (xmlNs *)0x0) || (pxVar2 = elem->ns->prefix, pxVar2 == (xmlChar *)0x0)) {
        pxVar2 = elem->name;
      }
      else {
        pxVar2 = xmlBuildQName(elem->name,pxVar2,local_68,0x32);
        pxVar4 = attr->ns;
      }
      if (pxVar4 == (xmlNs *)0x0) {
        ncname = attr->name;
      }
      else {
        ncname = attr->name;
        if (pxVar4->prefix != (xmlChar *)0x0) {
          ncname = xmlBuildQName(ncname,pxVar4->prefix,axStack_a8,0x32);
        }
      }
      pxVar3 = (xmlAttributePtr)0x0;
      if (((pxVar2 != (xmlChar *)0x0) && (ncname != (xmlChar *)0x0)) &&
         (pxVar3 = xmlGetDtdAttrDesc(doc->intSubset,pxVar2,ncname), pxVar3 == (xmlAttributePtr)0x0))
      {
        if (doc->extSubset == (xmlDtdPtr)0x0) {
          pxVar3 = (xmlAttributePtr)0x0;
        }
        else {
          pxVar3 = xmlGetDtdAttrDesc(doc->extSubset,pxVar2,ncname);
        }
      }
      if ((ncname != axStack_a8) && (ncname != attr->name)) {
        (*xmlFree)(ncname);
      }
      if ((pxVar2 != local_68) && (pxVar2 != elem->name)) {
        (*xmlFree)(pxVar2);
      }
      if ((pxVar3 != (xmlAttributePtr)0x0) && (pxVar3->atype == XML_ATTRIBUTE_ID))
      goto LAB_0018f8fa;
    }
    iVar1 = 0;
  }
  else {
LAB_0018f8fa:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL)) return(0);
    if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
        (!strcmp((char *) attr->name, "id")) &&
        (!strcmp((char *) attr->ns->prefix, "xml")))
	return(1);
    if (doc == NULL) return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL) &&
        (doc->type != XML_HTML_DOCUMENT_NODE)) {
	return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if ((xmlStrEqual(BAD_CAST "id", attr->name)) ||
	    ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    ((elem == NULL) || (xmlStrEqual(elem->name, BAD_CAST "a")))))
	    return(1);
	return(0);
    } else if (elem == NULL) {
	return(0);
    } else {
	xmlAttributePtr attrDecl = NULL;

	xmlChar felem[50], fattr[50];
	xmlChar *fullelemname, *fullattrname;

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;

	fullattrname = (attr->ns != NULL && attr->ns->prefix != NULL) ?
	    xmlBuildQName(attr->name, attr->ns->prefix, fattr, 50) :
	    (xmlChar *)attr->name;

	if (fullelemname != NULL && fullattrname != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullelemname,
		                         fullattrname);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullelemname,
					     fullattrname);
	}

	if ((fullattrname != fattr) && (fullattrname != attr->name))
	    xmlFree(fullattrname);
	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }
    return(0);
}